

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intervals.cpp
# Opt level: O2

void __thiscall
IntervalsTest_TestNoOverlapFound_Test::TestBody(IntervalsTest_TestNoOverlapFound_Test *this)

{
  char *message;
  initializer_list<int> __l;
  undefined1 auStack_78 [8];
  vector<wasm::Interval,_std::allocator<wasm::Interval>_> intervals;
  undefined1 local_58 [8];
  vector<int,_std::allocator<int>_> expected;
  int local_28 [2];
  AssertionResult gtest_ar;
  
  auStack_78 = (undefined1  [8])0x0;
  intervals.super__Vector_base<wasm::Interval,_std::allocator<wasm::Interval>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  intervals.super__Vector_base<wasm::Interval,_std::allocator<wasm::Interval>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._0_4_ = 0;
  expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)CONCAT44(expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_,4);
  local_28[0] = 2;
  std::vector<wasm::Interval,std::allocator<wasm::Interval>>::emplace_back<int,int,int>
            ((vector<wasm::Interval,std::allocator<wasm::Interval>> *)auStack_78,(int *)local_58,
             (int *)&expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,local_28);
  local_58._0_4_ = 4;
  expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)CONCAT44(expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_,8);
  local_28[0] = 2;
  std::vector<wasm::Interval,std::allocator<wasm::Interval>>::emplace_back<int,int,int>
            ((vector<wasm::Interval,std::allocator<wasm::Interval>> *)auStack_78,(int *)local_58,
             (int *)&expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,local_28);
  expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&DAT_100000000;
  __l._M_len = 2;
  __l._M_array = (iterator)
                 &expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_58,__l,(allocator_type *)local_28);
  ::wasm::IntervalProcessor::filterOverlaps
            ((vector *)
             &expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage);
  testing::internal::
  CmpHelperEQ<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
            ((internal *)local_28,"IntervalProcessor::filterOverlaps(intervals)","expected",
             (vector<int,_std::allocator<int>_> *)
             &expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,(vector<int,_std::allocator<int>_> *)local_58);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)
             &expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage);
  if (local_28[0]._0_1_ == (allocator_type)0x0) {
    testing::Message::Message
              ((Message *)
               &expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    if (gtest_ar._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/intervals.cpp"
               ,0x19,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,
               (Message *)
               &expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage != (pointer)0x0) {
      (**(code **)(*(long *)expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_58);
  std::_Vector_base<wasm::Interval,_std::allocator<wasm::Interval>_>::~_Vector_base
            ((_Vector_base<wasm::Interval,_std::allocator<wasm::Interval>_> *)auStack_78);
  return;
}

Assistant:

TEST(IntervalsTest, TestNoOverlapFound) {
  std::vector<Interval> intervals;
  intervals.emplace_back(0, 4, 2);
  intervals.emplace_back(4, 8, 2);
  std::vector<int> expected{0, 1};
  ASSERT_EQ(IntervalProcessor::filterOverlaps(intervals), expected);
}